

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_refract_vec2(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  float fVar3;
  float res;
  Vector<float,_2> res_3;
  Vector<float,_2> res_1;
  Vector<float,_2> res_2;
  float local_40 [4];
  float local_30 [2];
  Vec4 *local_28;
  int local_20 [2];
  float local_18 [2];
  ulong local_10;
  
  local_30[0] = c->in[0].m_data[3];
  local_30[1] = c->in[0].m_data[1];
  uVar1 = *(ulong *)c->in[1].m_data;
  local_10 = uVar1 << 0x20 | uVar1 >> 0x20;
  local_40[3] = c->in[2].m_data[1];
  local_40[2] = 0.0;
  lVar2 = 0;
  do {
    local_40[2] = local_40[2] + *(float *)((long)&local_10 + lVar2 * 4) * local_30[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  fVar3 = 1.0 - local_40[3] * local_40[3] * (1.0 - local_40[2] * local_40[2]);
  if (0.0 <= fVar3) {
    local_28 = (Vec4 *)0x0;
    lVar2 = 0;
    do {
      *(float *)((long)&local_28 + lVar2 * 4) = local_30[lVar2] * local_40[3];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    local_18[0] = 0.0;
    local_18[1] = 0.0;
    lVar2 = 0;
    do {
      local_18[lVar2] =
           *(float *)((long)&local_10 + lVar2 * 4) * (local_40[3] * local_40[2] + fVar3);
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    local_40[0] = 0.0;
    local_40[1] = 0.0;
    lVar2 = 0;
    do {
      local_40[lVar2] = *(float *)((long)&local_28 + lVar2 * 4) - local_18[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
  }
  else {
    local_40[0] = 0.0;
    local_40[1] = 0.0;
  }
  local_28 = &c->color;
  local_20[0] = 1;
  local_20[1] = 2;
  lVar2 = 0;
  do {
    (c->color).m_data[local_20[lVar2]] = local_40[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

void eval_refract_vec2	(ShaderEvalContext& c) { c.color.yz()	= refract(c.in[0].swizzle(3, 1),       c.in[1].swizzle(1, 0),       c.in[2].y()); }